

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O3

void __thiscall
cmLocalUnixMakefileGenerator3::~cmLocalUnixMakefileGenerator3(cmLocalUnixMakefileGenerator3 *this)

{
  ~cmLocalUnixMakefileGenerator3(this);
  operator_delete(this,0x290);
  return;
}

Assistant:

cmLocalUnixMakefileGenerator3::~cmLocalUnixMakefileGenerator3()
{
}